

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

LY_ERR lyjson_ctx_next(lyjson_ctx *jsonctx,LYJSON_PARSER_STATUS *status)

{
  char cVar1;
  ly_in *plVar2;
  LYJSON_PARSER_STATUS LVar3;
  uint uVar4;
  uint32_t uVar5;
  LY_ERR LVar6;
  char *pcVar7;
  ly_bool array_end;
  char *pcVar8;
  ly_ctx *ctx;
  void *pvStackY_30;
  
  if (jsonctx == (lyjson_ctx *)0x0) {
    __assert_fail("jsonctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x3d6,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
  }
  LVar3 = lyjson_ctx_status(jsonctx);
  switch(LVar3) {
  case LYJSON_ERROR:
    ly_log(jsonctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",0x408);
    return LY_EINT;
  case LYJSON_OBJECT_NEXT:
    uVar5 = (jsonctx->status).count;
    if (uVar5 == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3e1,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    (jsonctx->status).count = uVar5 - 1;
  case LYJSON_OBJECT:
    LVar6 = lyjson_next_object_name(jsonctx);
    goto LAB_0011ce49;
  case LYJSON_OBJECT_CLOSED:
  case LYJSON_ARRAY_CLOSED:
    break;
  case LYJSON_ARRAY:
    array_end = '\x01';
    goto LAB_0011cd90;
  case LYJSON_ARRAY_NEXT:
    uVar5 = (jsonctx->status).count;
    if (uVar5 == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3e5,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
    goto LAB_0011cd7e;
  case LYJSON_OBJECT_NAME:
    lyjson_ctx_set_value(jsonctx,(char *)0x0,0,'\0');
    uVar5 = (jsonctx->status).count;
    if (uVar5 == 0) {
      __assert_fail("jsonctx->status.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                    0x3ea,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)"
                   );
    }
LAB_0011cd7e:
    (jsonctx->status).count = uVar5 - 1;
switchD_0011cc53_caseD_d:
    array_end = '\0';
LAB_0011cd90:
    LVar6 = lyjson_next_value(jsonctx,array_end);
    goto LAB_0011ce49;
  case LYJSON_NUMBER:
  case LYJSON_STRING:
  case LYJSON_TRUE:
  case LYJSON_FALSE:
  case LYJSON_NULL:
    goto switchD_0011cc53_caseD_8;
  case LYJSON_END:
    goto switchD_0011cc53_caseD_d;
  default:
    goto switchD_0011cc53_default;
  }
  uVar5 = (jsonctx->status).count;
  if (uVar5 == 0) {
    __assert_fail("jsonctx->status.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x3ef,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
  }
  (jsonctx->status).count = uVar5 - 1;
switchD_0011cc53_caseD_8:
  lyjson_ctx_set_value(jsonctx,(char *)0x0,0,'\0');
  uVar5 = (jsonctx->status).count;
  if (uVar5 == 0) {
    __assert_fail("jsonctx->status.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x3f7,"LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
  }
  (jsonctx->status).count = uVar5 - 1;
  LVar3 = lyjson_ctx_status(jsonctx);
  if (LVar3 != LYJSON_END) {
    if (LVar3 == LYJSON_ARRAY) {
      plVar2 = jsonctx->in;
      cVar1 = *plVar2->current;
      if (cVar1 == ']') {
        ly_in_skip(plVar2,1);
        pvStackY_30 = (void *)0x6;
      }
      else {
        if (cVar1 != ',') {
          if (cVar1 == '\0') goto LAB_0011cd07;
          ctx = jsonctx->ctx;
          uVar4 = LY_VCODE_INSTREXP_len(plVar2->current);
          pcVar8 = jsonctx->in->current;
          pcVar7 = "a JSON array-end or next item";
          goto LAB_0011ce0e;
        }
        ly_in_skip(plVar2,1);
        pvStackY_30 = (void *)0x5;
      }
    }
    else {
      if (LVar3 != LYJSON_OBJECT) {
        __assert_fail("cur == LYJSON_END",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c"
                      ,0x402,
                      "LY_ERR lyjson_ctx_next(struct lyjson_ctx *, enum LYJSON_PARSER_STATUS *)");
      }
      plVar2 = jsonctx->in;
      cVar1 = *plVar2->current;
      if (cVar1 == '}') {
        ly_in_skip(plVar2,1);
        pvStackY_30 = (void *)0x3;
      }
      else {
        if (cVar1 != ',') {
          if (cVar1 == '\0') {
LAB_0011cd07:
            ly_vlog(jsonctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
            return LY_EVALID;
          }
          ctx = jsonctx->ctx;
          uVar4 = LY_VCODE_INSTREXP_len(plVar2->current);
          pcVar8 = jsonctx->in->current;
          pcVar7 = "a JSON object-end or next item";
LAB_0011ce0e:
          ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                  (ulong)uVar4,pcVar8,pcVar7);
          return LY_EVALID;
        }
        ly_in_skip(plVar2,1);
        pvStackY_30 = (void *)0x2;
      }
    }
    LVar6 = ly_set_add(&jsonctx->status,pvStackY_30,'\x01',(uint32_t *)0x0);
LAB_0011ce49:
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
switchD_0011cc53_default:
    lyjson_skip_ws(jsonctx);
  }
  if (status != (LYJSON_PARSER_STATUS *)0x0) {
    LVar3 = lyjson_ctx_status(jsonctx);
    *status = LVar3;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyjson_ctx_next(struct lyjson_ctx *jsonctx, enum LYJSON_PARSER_STATUS *status)
{
    LY_ERR ret = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS cur;

    assert(jsonctx);

    cur = lyjson_ctx_status(jsonctx);
    switch (cur) {
    case LYJSON_OBJECT:
        LY_CHECK_GOTO(ret = lyjson_next_object_name(jsonctx), cleanup);
        break;
    case LYJSON_ARRAY:
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 1), cleanup);
        break;
    case LYJSON_OBJECT_NEXT:
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_object_name(jsonctx), cleanup);
        break;
    case LYJSON_ARRAY_NEXT:
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_OBJECT_NAME:
        lyjson_ctx_set_value(jsonctx, NULL, 0, 0);
        LYJSON_STATUS_POP(jsonctx);
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_OBJECT_CLOSED:
    case LYJSON_ARRAY_CLOSED:
        LYJSON_STATUS_POP(jsonctx);
    /* fallthrough */
    case LYJSON_NUMBER:
    case LYJSON_STRING:
    case LYJSON_TRUE:
    case LYJSON_FALSE:
    case LYJSON_NULL:
        lyjson_ctx_set_value(jsonctx, NULL, 0, 0);
        LYJSON_STATUS_POP(jsonctx);
        cur = lyjson_ctx_status(jsonctx);

        if (cur == LYJSON_OBJECT) {
            LY_CHECK_GOTO(ret = lyjson_next_object_item(jsonctx), cleanup);
            break;
        } else if (cur == LYJSON_ARRAY) {
            LY_CHECK_GOTO(ret = lyjson_next_array_item(jsonctx), cleanup);
            break;
        }

        assert(cur == LYJSON_END);
        goto cleanup;
    case LYJSON_END:
        LY_CHECK_GOTO(ret = lyjson_next_value(jsonctx, 0), cleanup);
        break;
    case LYJSON_ERROR:
        LOGINT(jsonctx->ctx);
        ret = LY_EINT;
        goto cleanup;
    }

    /* skip WS */
    lyjson_skip_ws(jsonctx);

cleanup:
    if (!ret && status) {
        *status = lyjson_ctx_status(jsonctx);
    }
    return ret;
}